

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

bool __thiscall fasttext::Autotune::quantize(Autotune *this,Args *args,Args *autotuneArgs)

{
  int iVar1;
  int64_t iVar2;
  ostream *this_00;
  void *this_01;
  long in_RDX;
  function<void_(float,_float,_double,_double,_long)> *in_RSI;
  int64_t in_stack_00000020;
  int in_stack_00000028;
  bool in_stack_0000002e;
  bool in_stack_0000002f;
  Autotune *in_stack_00000030;
  int64_t outputSize;
  TrainCallback *in_stack_000000b0;
  Args *in_stack_000000b8;
  FastText *in_stack_000000c0;
  Args *in_stack_000000d8;
  int64_t in_stack_ffffffffffffff60;
  Matrix *in_stack_ffffffffffffff68;
  FastText *in_stack_ffffffffffffff98;
  bool local_1;
  
  iVar2 = Args::getAutotuneModelSize(in_stack_000000d8);
  if (((double)iVar2 != -1.0) || (NAN((double)iVar2))) {
    std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x19b615);
    FastText::getOutputMatrix(in_stack_ffffffffffffff98);
    std::__shared_ptr_access<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x19b631);
    iVar2 = Matrix::size(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::shared_ptr<const_fasttext::DenseMatrix>::~shared_ptr
              ((shared_ptr<const_fasttext::DenseMatrix> *)0x19b64e);
    *(undefined1 *)((long)&in_RSI[8].super__Function_base._M_manager + 2) = 1;
    *(bool *)&in_RSI[8].super__Function_base._M_manager = 0xff < iVar2;
    *(undefined1 *)((long)&in_RSI[8].super__Function_base._M_manager + 1) = 1;
    Args::getAutotuneModelSize(in_stack_000000d8);
    iVar1 = getCutoffForFileSize
                      (in_stack_00000030,in_stack_0000002f,in_stack_0000002e,in_stack_00000028,
                       in_stack_00000020);
    in_RSI[8]._M_invoker = (_Invoker_type)(long)iVar1;
    if (2 < *(int *)(in_RDX + 0xe0)) {
      this_00 = std::operator<<((ostream *)&std::cout,"cutoff = ");
      this_01 = (void *)std::ostream::operator<<(this_00,(ulong)in_RSI[8]._M_invoker);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    }
    if (in_RSI[8]._M_invoker == (_Invoker_type)0x100) {
      local_1 = false;
    }
    else {
      std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x19b7a5);
      std::function<void_(float,_float,_double,_double,_long)>::function(in_RSI);
      FastText::quantize(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
      std::function<void_(float,_float,_double,_double,_long)>::~function
                ((function<void_(float,_float,_double,_double,_long)> *)0x19b7e4);
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Autotune::quantize(Args& args, const Args& autotuneArgs) {
  if (autotuneArgs.getAutotuneModelSize() == Args::kUnlimitedModelSize) {
    return true;
  }
  auto outputSize = fastText_->getOutputMatrix()->size(0);

  args.qnorm = true;
  args.qout = (outputSize >= kCutoffLimit);
  args.retrain = true;
  args.cutoff = getCutoffForFileSize(
      args.qout, args.qnorm, args.dsub, autotuneArgs.getAutotuneModelSize());
  LOG_VAL(cutoff, args.cutoff);
  if (args.cutoff == kCutoffLimit) {
    return false;
  }
  fastText_->quantize(args);

  return true;
}